

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean_array_2_d.cxx
# Opt level: O0

void __thiscall BooleanArray2D::set(BooleanArray2D *this,uint row,uint col,bool value)

{
  out_of_range *poVar1;
  byte *pbVar2;
  byte bVar3;
  uint uVar4;
  uchar *byte;
  uint bit_index;
  uint byte_index;
  uint index;
  bool value_local;
  uint col_local;
  uint row_local;
  BooleanArray2D *this_local;
  
  if (this->rows <= row) {
    poVar1 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(poVar1,"Row out of range.");
    __cxa_throw(poVar1,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  if (this->cols <= col) {
    poVar1 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(poVar1,"Column out of range.");
    __cxa_throw(poVar1,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  uVar4 = row * this->cols + col;
  bVar3 = (byte)uVar4 & 7;
  pbVar2 = this->data + (uVar4 >> 3);
  if (value) {
    *pbVar2 = *pbVar2 | (byte)(1 << bVar3);
  }
  else {
    *pbVar2 = *pbVar2 & ((byte)(1 << bVar3) ^ 0xff);
  }
  return;
}

Assistant:

void BooleanArray2D::set(unsigned int row, unsigned int col, bool value)
{
    if(row >= rows) {
        throw std::out_of_range("Row out of range.");
    }
    if(col >= cols) {
        throw std::out_of_range("Column out of range.");
    }

    unsigned int index = row * cols + col;
    unsigned int byte_index = index / 8;
    unsigned int bit_index = index % 8;
    unsigned char &byte = data[byte_index];
    //set bit with bit_index in byte to 1 if value is true and to 0 if value is false:
    if(value) {
        byte |= 1U << bit_index;
    } else {
        byte &= ~(1U << bit_index);
    }
}